

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O3

void SoapySDR::Device::unmake(Device *device)

{
  int iVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  const_iterator __position;
  runtime_error *this;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  _Base_ptr in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>,_std::_Rb_tree_iterator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
  pVar6;
  _Base_ptr local_18;
  
  local_18 = in_RDI;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)getFactoryMutex()::mutex);
  if (iVar1 != 0) {
    uVar4 = std::__throw_system_error(iVar1);
    __cxa_free_exception();
    pthread_mutex_unlock((pthread_mutex_t *)getFactoryMutex()::mutex);
    _Unwind_Resume(uVar4);
  }
  getDeviceCounts();
  if (getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Base_ptr)0x0) {
    p_Var2 = &getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (*(_Base_ptr *)(p_Var5 + 1) >= in_RDI) {
        p_Var2 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(_Base_ptr *)(p_Var5 + 1) < in_RDI];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != &getDeviceCounts::table._M_t._M_impl.super__Rb_tree_header) &&
       (*(_Base_ptr *)(p_Var2 + 1) <= in_RDI)) {
      getDeviceCounts();
      pmVar3 = std::
               map<SoapySDR::Device_*,_unsigned_long,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
               ::operator[](&getDeviceCounts::table,(key_type *)&local_18);
      *pmVar3 = *pmVar3 - 1;
      getDeviceCounts();
      pmVar3 = std::
               map<SoapySDR::Device_*,_unsigned_long,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
               ::operator[](&getDeviceCounts::table,(key_type *)&local_18);
      if (*pmVar3 == 0) {
        getDeviceCounts();
        pVar6 = std::
                _Rb_tree<SoapySDR::Device_*,_std::pair<SoapySDR::Device_*const,_unsigned_long>,_std::_Select1st<std::pair<SoapySDR::Device_*const,_unsigned_long>_>,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
                ::equal_range(&getDeviceCounts::table._M_t,(key_type *)&local_18);
        std::
        _Rb_tree<SoapySDR::Device_*,_std::pair<SoapySDR::Device_*const,_unsigned_long>,_std::_Select1st<std::pair<SoapySDR::Device_*const,_unsigned_long>_>,_std::less<SoapySDR::Device_*>,_std::allocator<std::pair<SoapySDR::Device_*const,_unsigned_long>_>_>
        ::_M_erase_aux(&getDeviceCounts::table._M_t,(_Base_ptr)pVar6.first._M_node,
                       (_Base_ptr)pVar6.second._M_node);
        if (local_18 != (_Base_ptr)0x0) {
          (**(code **)(*(long *)local_18 + 8))();
        }
        getDeviceTable_abi_cxx11_();
        __position._M_node =
             getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left;
        getDeviceTable_abi_cxx11_();
        while ((_Rb_tree_header *)__position._M_node !=
               &getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          if (__position._M_node[2]._M_left == local_18) {
            getDeviceTable_abi_cxx11_();
            std::_Rb_tree<$be4b8079$>::_M_erase_aux
                      (&getDeviceTable[abi:cxx11]()::table_abi_cxx11_._M_t,__position);
            break;
          }
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          getDeviceTable_abi_cxx11_();
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)getFactoryMutex()::mutex);
      return;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"SoapySDR::Device::unmake() unknown device");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SoapySDR::Device::unmake(Device *device)
{
    std::lock_guard<std::recursive_mutex> lock(getFactoryMutex());

    if (getDeviceCounts().count(device) == 0)
    {
        throw std::runtime_error("SoapySDR::Device::unmake() unknown device");
    }

    getDeviceCounts()[device]--;
    if (getDeviceCounts()[device] == 0)
    {
        getDeviceCounts().erase(device);
        delete device;

        //cleanup the argument to device table
        for (auto it = getDeviceTable().begin(); it != getDeviceTable().end(); ++it)
        {
            if (it->second == device)
            {
                getDeviceTable().erase(it);
                return;
            }
        }
    }
}